

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O2

optional_ptr<duckdb::Transaction,_true> __thiscall
duckdb::MetaTransaction::TryGetTransaction(MetaTransaction *this,AttachedDatabase *db)

{
  iterator iVar1;
  Transaction *pTVar2;
  key_type local_20;
  
  ::std::mutex::lock(&this->lock);
  local_20._M_data = db;
  iVar1 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->transactions)._M_h,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pTVar2 = (Transaction *)0x0;
  }
  else {
    pTVar2 = *(Transaction **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
                     ._M_cur + 0x10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return (optional_ptr<duckdb::Transaction,_true>)pTVar2;
}

Assistant:

optional_ptr<Transaction> MetaTransaction::TryGetTransaction(AttachedDatabase &db) {
	lock_guard<mutex> guard(lock);
	auto entry = transactions.find(db);
	if (entry == transactions.end()) {
		return nullptr;
	} else {
		return &entry->second.get();
	}
}